

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void __thiscall
kratos::GeneratorPropertyVisitor::visit(GeneratorPropertyVisitor *this,Generator *generator)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
  *this_00;
  element_type *peVar2;
  shared_ptr<kratos::Stmt> local_60;
  undefined1 local_50 [8];
  shared_ptr<kratos::AssertPropertyStmt> stmt;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>
  *iter;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
  *properties;
  Generator *generator_local;
  GeneratorPropertyVisitor *this_local;
  
  this_00 = Generator::properties_abi_cxx11_(generator);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
           ::begin(this_00);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>_>
            ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&iter);
    if (!bVar1) break;
    stmt.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>
            ::operator*(&__end2);
    std::make_shared<kratos::AssertPropertyStmt,std::shared_ptr<kratos::Property>const&>
              ((shared_ptr<kratos::Property> *)local_50);
    std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssertPropertyStmt,void>
              (&local_60,(shared_ptr<kratos::AssertPropertyStmt> *)local_50);
    Generator::add_stmt(generator,&local_60);
    std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_60);
    peVar2 = std::
             __shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    (*(peVar2->super_AssertBase).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar2,generator);
    std::shared_ptr<kratos::AssertPropertyStmt>::~shared_ptr
              ((shared_ptr<kratos::AssertPropertyStmt> *)local_50);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Property>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto const& properties = generator->properties();
        for (auto const& iter : properties) {
            auto stmt = std::make_shared<AssertPropertyStmt>(iter.second);
            generator->add_stmt(stmt);
            stmt->set_parent(generator);
        }
    }